

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

iterator __thiscall
slang::SmallVectorBase<(anonymous_namespace)::Constructable>::insert
          (SmallVectorBase<(anonymous_namespace)::Constructable> *this,const_iterator pos,
          Constructable *val)

{
  iterator pCVar1;
  Constructable *in_stack_00000048;
  const_iterator in_stack_00000050;
  SmallVectorBase<(anonymous_namespace)::Constructable> *in_stack_00000058;
  
  pCVar1 = emplace<(anonymous_namespace)::Constructable>
                     (in_stack_00000058,in_stack_00000050,in_stack_00000048);
  return pCVar1;
}

Assistant:

iterator insert(const_iterator pos, T&& val) { return emplace(pos, std::move(val)); }